

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

size_t __thiscall helics::detail::convertToBinary(detail *this,byte *data,string_view val)

{
  *(undefined8 *)this = 0;
  *this = (detail)0xe;
  this[3] = (detail)0x0;
  this[4] = SUB81((ulong)data >> 0x18,0);
  this[5] = SUB81((ulong)data >> 0x10,0);
  this[6] = SUB81((ulong)data >> 8,0);
  this[7] = SUB81(data,0);
  if (data != (byte *)0x0) {
    memcpy(this + 8,(void *)val._M_len,(size_t)data);
  }
  return (size_t)(data + 8);
}

Assistant:

size_t convertToBinary(std::byte* data, std::string_view val)
{
    addCodeAndSize(data, stringCode, val.size());
    if (!val.empty()) {
        std::memcpy(data + 8U, val.data(), val.size());
    }
    return val.size() + 8U;
}